

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBToARGB4444Row_C(uint8 *src_argb,uint8 *dst_rgb,int width)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  unkuint9 Var5;
  undefined1 auVar6 [11];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  uint6 uVar13;
  long lVar14;
  undefined1 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [15];
  
  auVar9 = _DAT_00128530;
  for (lVar14 = 0; (int)lVar14 < width + -1; lVar14 = lVar14 + 2) {
    auVar17 = ZEXT415(CONCAT22((ushort)((uint)*(undefined4 *)(src_argb + lVar14 * 4 + 2) >> 0x14),
                               (ushort)*(undefined4 *)(src_argb + lVar14 * 4 + 2) >> 4)) &
              auVar9._0_15_;
    Var5 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar17[3]);
    auVar11._9_6_ = 0;
    auVar11._0_9_ = Var5;
    auVar6._1_10_ = SUB1510(auVar11 << 0x30,5);
    auVar6[0] = auVar17[2];
    auVar12._11_4_ = 0;
    auVar12._0_11_ = auVar6;
    auVar3[2] = auVar17[1];
    auVar3._0_2_ = auVar17._0_2_;
    auVar3._3_12_ = SUB1512(auVar12 << 0x20,3);
    auVar4._2_13_ = auVar3._2_13_;
    auVar4._0_2_ = auVar17._0_2_ & 0xff;
    auVar1._10_2_ = 0;
    auVar1._0_10_ = auVar4._0_10_;
    auVar1._12_2_ = (short)Var5;
    uVar13 = CONCAT42(auVar1._10_4_,auVar6._0_2_);
    auVar7._6_8_ = 0;
    auVar7._0_6_ = uVar13;
    auVar2._4_2_ = auVar3._2_2_;
    auVar2._0_4_ = auVar4._0_4_;
    auVar2._6_8_ = SUB148(auVar7 << 0x40,6);
    *(uint *)(dst_rgb + lVar14 * 2) =
         (auVar1._10_4_ >> 0x10) * 0x100000 | auVar2._4_4_ * 0x1000 |
         (uint)(((ulong)uVar13 & 0xffffffff) * 0x10000) | (auVar4._0_4_ & 0xffff) * 0x100 |
         (src_argb[lVar14 * 4 + 7] & 0xfffffff0) << 0x18 |
         src_argb[lVar14 * 4 + 1] & 0xfffffff0 | (uint)(src_argb[lVar14 * 4] >> 4) |
         (src_argb[lVar14 * 4 + 6] & 0xf0) << 0x14;
  }
  if ((width & 1U) != 0) {
    auVar16 = ZEXT216(*(ushort *)(src_argb + lVar14 * 4 + 2) >> 4) & _DAT_00128530;
    auVar10._10_6_ = 0;
    auVar10._0_10_ = SUB1610(ZEXT116(0) << 0x40,6);
    auVar9._11_5_ = 0;
    auVar9._0_11_ = SUB1611(auVar10 << 0x30,5);
    uVar15 = auVar16[1];
    auVar8._2_12_ = SUB1612(auVar9 << 0x28,4);
    auVar8[1] = uVar15;
    auVar8[0] = uVar15;
    uVar15 = auVar16[0];
    *(ushort *)(dst_rgb + lVar14 * 2) =
         auVar8._0_2_ * 0x1000 |
         CONCAT11(uVar15,uVar15) * 0x100 |
         src_argb[lVar14 * 4 + 1] & 0xfff0 | (ushort)(src_argb[lVar14 * 4] >> 4);
  }
  return;
}

Assistant:

void ARGBToARGB4444Row_C(const uint8* src_argb, uint8* dst_rgb, int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8 b0 = src_argb[0] >> 4;
    uint8 g0 = src_argb[1] >> 4;
    uint8 r0 = src_argb[2] >> 4;
    uint8 a0 = src_argb[3] >> 4;
    uint8 b1 = src_argb[4] >> 4;
    uint8 g1 = src_argb[5] >> 4;
    uint8 r1 = src_argb[6] >> 4;
    uint8 a1 = src_argb[7] >> 4;
    *(uint32*)(dst_rgb) = b0 | (g0 << 4) | (r0 << 8) | (a0 << 12) | (b1 << 16) |
                          (g1 << 20) | (r1 << 24) | (a1 << 28);
    dst_rgb += 4;
    src_argb += 8;
  }
  if (width & 1) {
    uint8 b0 = src_argb[0] >> 4;
    uint8 g0 = src_argb[1] >> 4;
    uint8 r0 = src_argb[2] >> 4;
    uint8 a0 = src_argb[3] >> 4;
    *(uint16*)(dst_rgb) = b0 | (g0 << 4) | (r0 << 8) | (a0 << 12);
  }
}